

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsFreewheel::ChShaftsFreewheel(ChShaftsFreewheel *this,ChShaftsFreewheel *other)

{
  double dVar1;
  ChConstraintTwoGenericBoxed *pCVar2;
  undefined1 auVar3 [64];
  
  ChPhysicsItem::ChPhysicsItem((ChPhysicsItem *)this,(ChPhysicsItem *)other);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsFreewheel_00b252c0;
  this->violation = 0.0;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.c_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.l_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.b_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.cfm_i =
       0.0;
  auVar3 = ZEXT464(0) << 0x40;
  pCVar2 = &this->constraint;
  (pCVar2->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (pCVar2->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (pCVar2->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (pCVar2->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.active =
       true;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.mode =
       CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.g_i = 0.0
  ;
  *(undefined1 (*) [64])
   &(this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.variables_a = auVar3;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_a = (ChRowVectorDynamic<double>)auVar3._0_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_b = (ChRowVectorDynamic<double>)auVar3._16_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_a = (ChVectorDynamic<double>)auVar3._32_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_b = (ChVectorDynamic<double>)auVar3._48_16_;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.
  _vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoGeneric_00b3af80;
  (this->constraint).l_min = -1.0;
  (this->constraint).l_max = 1.0;
  this->step = other->step;
  this->jamming_mode = other->jamming_mode;
  this->phase = other->phase;
  dVar1 = other->torque_react;
  this->alpha_max = other->alpha_max;
  this->torque_react = dVar1;
  this->free_forward = other->free_forward;
  return;
}

Assistant:

ChShaftsFreewheel::ChShaftsFreewheel(const ChShaftsFreewheel& other) : ChShaftsCouple(other), violation(0) {
    step = other.step;
    torque_react = other.torque_react;
    jamming_mode = other.jamming_mode;
    phase = other.phase;
    alpha_max = other.alpha_max;
    free_forward = other.free_forward;
}